

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  byte *pbVar1;
  SnapShot *pSVar2;
  SnapEntry *pSVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  pSVar2 = (J->cur).snap;
  pSVar3 = (J->cur).snapmap;
  pSVar3[(uint)pSVar2[nsnap - 1].nent + pSVar2[nsnap - 1].mapofs] = pSVar3[pSVar2->nent];
  (J->cur).nsnapmap = nsnapmap;
  (J->cur).nsnap = (uint16_t)nsnap;
  (J->guardemit).irt = '\0';
  lj_ir_rollback(J,ins);
  lVar5 = 0;
  do {
    uVar7 = (uint)J->bpropcache[lVar5].val;
    uVar8 = (uint)J->bpropcache[lVar5 + 1].val;
    uVar9 = (uint)J->bpropcache[lVar5 + 3].val;
    bVar4 = ((ins < uVar7) * ins | (ins >= uVar7) * uVar7) == ins;
    if (bVar4) {
      J->bpropcache[lVar5].key = 0;
    }
    if (((ins < uVar8) * ins | (ins >= uVar8) * uVar8) == ins) {
      J->bpropcache[lVar5 + 1].key = 0;
    }
    if (bVar4) {
      J->bpropcache[lVar5 + 2].key = 0;
    }
    if (((ins < uVar9) * ins | (ins >= uVar9) * uVar9) == ins) {
      J->bpropcache[lVar5 + 3].key = 0;
    }
    uVar7 = (uint)J->bpropcache[lVar5 + 4].val;
    uVar8 = (uint)J->bpropcache[lVar5 + 5].val;
    uVar9 = (uint)J->bpropcache[lVar5 + 7].val;
    bVar4 = ((ins < uVar7) * ins | (ins >= uVar7) * uVar7) == ins;
    if (bVar4) {
      J->bpropcache[lVar5 + 4].key = 0;
    }
    if (((ins < uVar8) * ins | (ins >= uVar8) * uVar8) == ins) {
      J->bpropcache[lVar5 + 5].key = 0;
    }
    if (bVar4) {
      J->bpropcache[lVar5 + 6].key = 0;
    }
    if (((ins < uVar9) * ins | (ins >= uVar9) * uVar9) == ins) {
      J->bpropcache[lVar5 + 7].key = 0;
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  if (0x8000 < ins - 1) {
    uVar6 = (ulong)(ins - 1);
    do {
      pbVar1 = (byte *)((long)(J->cur).ir + uVar6 * 8 + 4);
      *pbVar1 = *pbVar1 & 0x9f;
      uVar6 = uVar6 - 1;
    } while (0x8000 < (uint)uVar6);
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint32_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}